

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawFrame
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextFrame *frame)

{
  QRectF *clip;
  QFixed *pQVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QPointer<QTextFrame> *pQVar7;
  QFixed *pQVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  uint uVar12;
  Iterator it;
  QRectF cellRect;
  QRectF cellRect_00;
  qreal qVar13;
  QFixed *pQVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  QTextFrameData *fd;
  long lVar21;
  QTextTable *this_00;
  ulong uVar22;
  int *selectedTableCells;
  QTextTable *pQVar23;
  QTextFrame *pQVar24;
  QTextFrameLayoutData *data;
  QPen *p;
  QBrush *pQVar25;
  QTextLayout *this_01;
  int col;
  int iVar26;
  ulong uVar27;
  long lVar28;
  QFixed *pQVar29;
  undefined8 *puVar30;
  PaintContext *pPVar31;
  ulong uVar32;
  int iVar33;
  int c;
  QTextCursor *this_02;
  size_t totalCapacity;
  DataPtr DVar34;
  long in_FS_OFFSET;
  byte bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QSizeF QVar42;
  QTextTableData *local_598;
  double dStack_590;
  uint local_570;
  int col_start;
  undefined4 uStack_544;
  double dStack_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  int num_cols;
  QRectF local_518;
  QPointF local_4f8;
  QPointF local_4e8;
  QPointF local_4d8;
  int row_start;
  undefined4 uStack_4c4;
  QPalette QStack_4c0;
  int local_4b0;
  undefined4 uStack_4ac;
  qreal qStack_4a8;
  qreal local_4a0;
  qreal qStack_498;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection> local_490;
  int num_rows;
  undefined4 uStack_474;
  undefined1 *puStack_470;
  QTextBlock local_468;
  QPen oldPen;
  int iStack_450;
  int iStack_44c;
  ColorGroup CStack_448;
  undefined4 local_444;
  int local_440 [258];
  long local_38;
  
  bVar35 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fd = (QTextFrameData *)QTextFrame::layoutData(frame);
  if (fd == (QTextFrameData *)0x0) {
    lVar21 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar21 == 0) {
      fd = (QTextFrameData *)operator_new(0x78);
      (fd->super_QTextFrameLayoutData)._vptr_QTextFrameLayoutData =
           (_func_int **)&PTR__QTextFrameData_007dcf10;
      (fd->position).x = 0;
      (fd->position).y = 0;
      (fd->size).width = 0;
      (fd->size).height = 0;
      fd->topMargin = 0;
      fd->bottomMargin = 0;
      fd->leftMargin = 0;
      fd->rightMargin = 0;
      fd->border = 0;
      fd->padding = 0;
      fd->contentsWidth = 0;
      fd->contentsHeight = 0;
      fd->oldContentsWidth = 0;
      fd->effectiveTopMargin = 0;
      fd->effectiveBottomMargin = 0;
      fd->minimumWidth = 0;
      (fd->maximumWidth).val = 0x1fffffc0;
      fd->currentLayoutStruct = (QTextLayoutStruct *)0x0;
      fd->sizeDirty = true;
      fd->layoutDirty = true;
      (fd->floats).d.d = (Data *)0x0;
      (fd->floats).d.ptr = (QPointer<QTextFrame> *)0x0;
      (fd->floats).d.size = 0;
    }
    else {
      fd = (QTextFrameData *)operator_new(0x160);
      (fd->position).x = 0;
      (fd->position).y = 0;
      (fd->size).width = 0;
      (fd->size).height = 0;
      fd->topMargin = 0;
      fd->bottomMargin = 0;
      fd->leftMargin = 0;
      fd->rightMargin = 0;
      fd->border = 0;
      fd->padding = 0;
      fd->contentsWidth = 0;
      fd->contentsHeight = 0;
      fd->oldContentsWidth = 0;
      fd->effectiveTopMargin = 0;
      fd->effectiveBottomMargin = 0;
      fd->minimumWidth = 0;
      (fd->maximumWidth).val = 0x1fffffc0;
      fd->currentLayoutStruct = (QTextLayoutStruct *)0x0;
      fd->sizeDirty = true;
      fd->layoutDirty = true;
      (fd->floats).d.d = (Data *)0x0;
      (fd->floats).d.ptr = (QPointer<QTextFrame> *)0x0;
      *(undefined1 (*) [16])&(fd->floats).d.size = (undefined1  [16])0x0;
      (fd->super_QTextFrameLayoutData)._vptr_QTextFrameLayoutData =
           (_func_int **)&PTR__QTextTableData_007dd0c0;
      fd[2].floats.d.d = (Data *)0x0;
      fd[2].floats.d.ptr = (QPointer<QTextFrame> *)0x0;
      memset(&fd[1].size,0,0xc0);
    }
    QTextFrame::setLayoutData(frame,&fd->super_QTextFrameLayoutData);
  }
  if (fd->layoutDirty != false) goto LAB_004e3862;
  dVar9 = offset->xp + (double)(fd->position).x.val * 0.015625;
  dVar10 = offset->yp + (double)(fd->position).y.val * 0.015625;
  auVar36._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
  auVar36._8_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
  auVar37 = maxpd(auVar36,_DAT_006747a0);
  uVar27 = -(ulong)(2147483647.0 < auVar36._8_8_) & 0x41dfffffffc00000;
  auVar38._0_8_ = ~-(ulong)(2147483647.0 < auVar36._0_8_) & auVar37._0_8_;
  auVar38._8_8_ = ~-(ulong)(2147483647.0 < auVar36._8_8_) & auVar37._8_8_;
  auVar37._8_4_ = (int)uVar27;
  auVar37._0_8_ = -(ulong)(2147483647.0 < auVar36._0_8_) & 0x41dfffffffc00000;
  auVar37._12_4_ = (int)(uVar27 >> 0x20);
  local_598 = (QTextTableData *)(double)(int)SUB168(auVar38 | auVar37,0);
  dStack_590 = (double)(int)SUB168(auVar38 | auVar37,8);
  clip = &context->clip;
  dVar9 = (context->clip).w;
  local_4d8.xp = (qreal)local_598;
  local_4d8.yp = dStack_590;
  if (((0.0 < dVar9) && (dVar10 = (context->clip).h, 0.0 < dVar10)) &&
     ((dVar2 = (context->clip).yp, dVar10 + dVar2 < dStack_590 ||
      ((((double)(fd->size).height.val * 0.015625 + dStack_590 < dVar2 ||
        (dVar9 + clip->xp < (double)local_598)) ||
       ((double)(fd->size).width.val * 0.015625 + (double)local_598 < clip->xp))))))
  goto LAB_004e3862;
  lcDraw();
  if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    oldPen.d.d.ptr._0_4_ = 2;
    oldPen.d.d.ptr._4_4_ = 0;
    local_440[0] = (int)lcDraw::category.name;
    local_440[1] = (int)((ulong)lcDraw::category.name >> 0x20);
    QMessageLogger::debug();
    qVar13 = local_518.xp;
    QVar39.m_data = (storage_type *)0x9;
    QVar39.m_size = (qsizetype)&row_start;
    QString::fromUtf8(QVar39);
    QTextStream::operator<<((QTextStream *)qVar13,(QString *)&row_start);
    if (_row_start != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)_row_start = *(int *)_row_start + -1;
      UNLOCK();
      if (*(int *)_row_start == 0) {
        QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_518.xp,' ');
    }
    iVar16 = QTextFrame::firstPosition(frame);
    QTextStream::operator<<((QTextStream *)local_518.xp,iVar16);
    if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_518.xp,' ');
    }
    qVar13 = local_518.xp;
    QVar40.m_data = (storage_type *)0x2;
    QVar40.m_size = (qsizetype)&row_start;
    QString::fromUtf8(QVar40);
    QTextStream::operator<<((QTextStream *)qVar13,(QString *)&row_start);
    if (_row_start != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)_row_start = *(int *)_row_start + -1;
      UNLOCK();
      if (*(int *)_row_start == 0) {
        QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_518.xp,' ');
    }
    iVar16 = QTextFrame::lastPosition(frame);
    QTextStream::operator<<((QTextStream *)local_518.xp,iVar16);
    if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_518.xp,' ');
    }
    qVar13 = local_518.xp;
    QVar41.m_data = (storage_type *)0x2;
    QVar41.m_size = (qsizetype)&row_start;
    QString::fromUtf8(QVar41);
    QTextStream::operator<<((QTextStream *)qVar13,(QString *)&row_start);
    if (_row_start != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)_row_start = *(int *)_row_start + -1;
      UNLOCK();
      if (*(int *)_row_start == 0) {
        QArrayData::deallocate((QArrayData *)_row_start,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_518.xp + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_518.xp,' ');
    }
    *(int *)((long)local_518.xp + 0x28) = *(int *)((long)local_518.xp + 0x28) + 1;
    ::operator<<((QDebug *)&local_4e8.yp,&local_4e8);
    QDebug::~QDebug((QDebug *)&local_4e8.yp);
    QDebug::~QDebug((QDebug *)&local_4e8);
    QDebug::~QDebug((QDebug *)&local_518);
    local_598 = (QTextTableData *)local_4d8.xp;
    dStack_590 = local_4d8.yp;
  }
  local_468.p = (QTextDocumentPrivate *)0x0;
  local_468.n = 0;
  local_468._12_4_ = 0xaaaaaaaa;
  local_4f8.xp = local_4d8.xp;
  local_4f8.yp = local_4d8.yp;
  this_00 = (QTextTable *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
  local_518.xp = (qreal)local_598;
  local_518.yp = dStack_590;
  local_518.w = (double)(fd->size).width.val * 0.015625;
  local_518.h = (double)(fd->size).height.val * 0.015625;
  if (this_00 == (QTextTable *)0x0) {
    drawFrameDecoration(this,painter,frame,fd,clip,&local_518);
    CStack_448 = 0xaaaaaaaa;
    local_444 = 0xaaaaaaaa;
    local_440[0] = -0x55555556;
    local_440[1] = 0xaaaaaaaa;
    oldPen.d.d.ptr._0_4_ = 0xaaaaaaaa;
    oldPen.d.d.ptr._4_4_ = 0xaaaaaaaa;
    iStack_450 = -0x55555556;
    iStack_44c = -0x55555556;
    QTextFrame::begin((iterator *)&oldPen,frame);
    pQVar24 = QTextDocumentPrivate::rootFrame
                        ((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate);
    if (pQVar24 == frame) {
      frameIteratorForYPosition
                ((Iterator *)&row_start,this,(QFixed)(int)((context->clip).yp * 64.0));
      CStack_448 = QStack_4c0.currentGroup;
      local_444 = QStack_4c0._12_4_;
      local_440[0] = local_4b0;
      oldPen.d.d.ptr._0_4_ = row_start;
      oldPen.d.d.ptr._4_4_ = row_start._4_4_;
      iStack_450 = (int)QStack_4c0.d;
      iStack_44c = QStack_4c0.d._4_4_;
    }
    _row_start = (totally_ordered_wrapper<QTextFormatPrivate_*>)(QTextFormatPrivate *)0x0;
    QStack_4c0.d._0_4_ = 0;
    QStack_4c0.d._4_4_ = 0;
    QStack_4c0.currentGroup = Active;
    QStack_4c0._12_4_ = 0;
    uVar20 = (uint)(fd->floats).d.size;
    QList<QTextFrame_*>::reserve((QList<QTextFrame_*> *)&row_start,(long)(int)uVar20);
    if (0 < (int)uVar20) {
      uVar27 = (ulong)(uVar20 & 0x7fffffff);
      lVar21 = 8;
      do {
        pQVar7 = (fd->floats).d.ptr;
        lVar28 = *(long *)((long)pQVar7 + lVar21 + -8);
        if ((lVar28 == 0) || (*(int *)(lVar28 + 4) == 0)) {
          _col_start = (QTextFrame *)0x0;
        }
        else {
          _col_start = *(QTextFrame **)((long)&(pQVar7->wp).d + lVar21);
        }
        QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                  ((QPodArrayOps<QTextFrame*> *)&row_start,
                   CONCAT44(QStack_4c0._12_4_,QStack_4c0.currentGroup),(QTextFrame **)&col_start);
        QList<QTextFrame_*>::end((QList<QTextFrame_*> *)&row_start);
        lVar21 = lVar21 + 0x10;
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
    it.f._4_4_ = oldPen.d.d.ptr._4_4_;
    it.f._0_4_ = oldPen.d.d.ptr._0_4_;
    it.b = iStack_450;
    it.e = iStack_44c;
    it.cf._0_4_ = CStack_448;
    it.cf._4_4_ = local_444;
    it.cb = local_440[0];
    it._28_4_ = local_440[1];
    drawFlow(this,&local_4d8,painter,context,it,(QList<QTextFrame_*> *)&row_start,&local_468);
    if (_row_start != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)_row_start = *(int *)_row_start + -1;
      UNLOCK();
      if (*(int *)_row_start == 0) {
        QArrayData::deallocate((QArrayData *)_row_start,8,0x10);
      }
    }
  }
  else {
    local_570 = QTextTable::rows(this_00);
    iVar16 = QTextTable::columns(this_00);
    local_598 = (QTextTableData *)QTextFrame::layoutData((QTextFrame *)this_00);
    if (local_598 == (QTextTableData *)0x0) {
      lVar21 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
      if (lVar21 == 0) {
        local_598 = (QTextTableData *)operator_new(0x78);
        (local_598->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
             (_func_int **)&PTR__QTextFrameData_007dcf10;
        (local_598->super_QTextFrameData).position.x = 0;
        (local_598->super_QTextFrameData).position.y = 0;
        (local_598->super_QTextFrameData).size.width = 0;
        (local_598->super_QTextFrameData).size.height = 0;
        (local_598->super_QTextFrameData).topMargin = 0;
        (local_598->super_QTextFrameData).bottomMargin = 0;
        (local_598->super_QTextFrameData).leftMargin = 0;
        (local_598->super_QTextFrameData).rightMargin = 0;
        (local_598->super_QTextFrameData).border = 0;
        (local_598->super_QTextFrameData).padding = 0;
        (local_598->super_QTextFrameData).contentsWidth = 0;
        (local_598->super_QTextFrameData).contentsHeight = 0;
        (local_598->super_QTextFrameData).oldContentsWidth = 0;
        (local_598->super_QTextFrameData).effectiveTopMargin = 0;
        (local_598->super_QTextFrameData).effectiveBottomMargin = 0;
        (local_598->super_QTextFrameData).minimumWidth = 0;
        (local_598->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
        (local_598->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
        (local_598->super_QTextFrameData).sizeDirty = true;
        (local_598->super_QTextFrameData).layoutDirty = true;
        (local_598->super_QTextFrameData).floats.d.d = (Data *)0x0;
        (local_598->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
        (local_598->super_QTextFrameData).floats.d.size = 0;
      }
      else {
        local_598 = (QTextTableData *)operator_new(0x160);
        (local_598->super_QTextFrameData).position.x = 0;
        (local_598->super_QTextFrameData).position.y = 0;
        (local_598->super_QTextFrameData).size.width = 0;
        (local_598->super_QTextFrameData).size.height = 0;
        (local_598->super_QTextFrameData).topMargin = 0;
        (local_598->super_QTextFrameData).bottomMargin = 0;
        (local_598->super_QTextFrameData).leftMargin = 0;
        (local_598->super_QTextFrameData).rightMargin = 0;
        (local_598->super_QTextFrameData).border = 0;
        (local_598->super_QTextFrameData).padding = 0;
        (local_598->super_QTextFrameData).contentsWidth = 0;
        (local_598->super_QTextFrameData).contentsHeight = 0;
        (local_598->super_QTextFrameData).oldContentsWidth = 0;
        (local_598->super_QTextFrameData).effectiveTopMargin = 0;
        (local_598->super_QTextFrameData).effectiveBottomMargin = 0;
        (local_598->super_QTextFrameData).minimumWidth = 0;
        (local_598->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
        (local_598->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
        (local_598->super_QTextFrameData).sizeDirty = true;
        (local_598->super_QTextFrameData).layoutDirty = true;
        (local_598->super_QTextFrameData).floats.d.d = (Data *)0x0;
        (local_598->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
        (local_598->super_QTextFrameData).floats.d.size = 0;
        local_598->cellSpacing = 0;
        local_598->cellPadding = 0;
        (local_598->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
             (_func_int **)&PTR__QTextTableData_007dd0c0;
        (local_598->childFrameMap).d = (Data *)0x0;
        (local_598->childFrameMap).m_size = 0;
        memset(&local_598->minWidths,0,0xc0);
      }
      QTextFrame::setLayoutData((QTextFrame *)this_00,(QTextFrameLayoutData *)local_598);
    }
    selectedTableCells = local_440;
    memset(selectedTableCells,0xaa,0x400);
    uVar27 = (context->selections).d.size;
    DVar34.d.ptr = (totally_ordered_wrapper<QPenPrivate_*>)(uVar27 * 4);
    oldPen.d.d.ptr._0_4_ = 0x100;
    oldPen.d.d.ptr._4_4_ = 0;
    if (uVar27 < 0x41) {
      if (uVar27 != 0) goto LAB_004e2eff;
    }
    else {
      uVar27 = uVar27 << 4;
      oldPen.d.d.ptr = (DataPtr)(DataPtr)DVar34.d.ptr;
      uVar22 = QtPrivate::expectedAllocSize(uVar27,0x10);
      if (uVar22 == 0) {
LAB_004e2ecc:
        selectedTableCells = (int *)malloc(uVar27);
      }
      else {
        DVar34.d.ptr = (totally_ordered_wrapper<QPenPrivate_*>)(uVar22 >> 2);
        uVar27 = uVar22 & 0xfffffffffffffffc;
        if (uVar27 != 0) goto LAB_004e2ecc;
        selectedTableCells = (int *)0x0;
      }
      oldPen.d.d.ptr._0_4_ = SUB84(DVar34.d.ptr,0);
      oldPen.d.d.ptr._4_4_ = (undefined4)((ulong)DVar34.d.ptr >> 0x20);
LAB_004e2eff:
      lVar28 = 0xc;
      lVar21 = 0;
      uVar27 = 0;
      do {
        this_02 = (QTextCursor *)((long)&(((context->selections).d.ptr)->cursor).d.d.ptr + lVar21);
        row_start = 0xffffffff;
        _col_start = (QTextFrame *)CONCAT44(uStack_544,0xffffffff);
        _num_rows = (QTextTable *)CONCAT44(uStack_474,0xffffffff);
        num_cols = -1;
        pQVar23 = QTextCursor::currentTable(this_02);
        if (pQVar23 == this_00) {
          QTextCursor::selectedTableCells(this_02,&row_start,&num_rows,&col_start,&num_cols);
        }
        *(int *)((long)selectedTableCells + lVar28 + -0xc) = row_start;
        *(int *)((long)selectedTableCells + lVar28 + -8) = col_start;
        *(int *)((long)selectedTableCells + lVar28 + -4) = num_rows;
        *(int *)((long)selectedTableCells + lVar28) = num_cols;
        uVar27 = uVar27 + 1;
        lVar21 = lVar21 + 0x18;
        lVar28 = lVar28 + 0x10;
      } while (uVar27 < (ulong)(context->selections).d.size);
    }
    QVar42 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
    uVar17 = (uint)(QVar42.ht * 64.0);
    uVar20 = 0x1fffffc0;
    if (0 < (int)uVar17) {
      uVar20 = uVar17;
    }
    uVar17 = (local_598->super_QTextFrameData).position.y.val;
    for (pQVar24 = QTextFrame::parentFrame((QTextFrame *)this_00); pQVar24 != (QTextFrame *)0x0;
        pQVar24 = QTextFrame::parentFrame(pQVar24)) {
      data = QTextFrame::layoutData(pQVar24);
      if (data == (QTextFrameLayoutData *)0x0) {
        lVar21 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar21 == 0) {
          data = (QTextFrameLayoutData *)operator_new(0x78);
          data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
          data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          data = (QTextFrameLayoutData *)operator_new(0x160);
          data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
          data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
          data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(data + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar24,data);
      }
      uVar17 = uVar17 + *(int *)((long)&data[1]._vptr_QTextFrameLayoutData + 4);
    }
    uVar11 = -uVar17;
    if (0 < (int)uVar17) {
      uVar11 = uVar17;
    }
    uVar12 = -uVar20;
    if (0 < (int)uVar20) {
      uVar12 = uVar20;
    }
    iVar26 = (int)(((ulong)uVar11 * 0x40 + (ulong)(uVar12 >> 1)) / (ulong)uVar12);
    iVar33 = -iVar26;
    if (-1 < (int)(uVar17 ^ uVar20)) {
      iVar33 = iVar26;
    }
    iVar33 = iVar33 >> 6;
    uVar17 = uVar17 + (local_598->super_QTextFrameData).size.height.val;
    uVar11 = -uVar17;
    if (0 < (int)uVar17) {
      uVar11 = uVar17;
    }
    iVar18 = (int)(((ulong)uVar11 * 0x40 + (ulong)(uVar12 >> 1)) / (ulong)uVar12);
    iVar26 = -iVar18;
    if (-1 < (int)(uVar17 ^ uVar20)) {
      iVar26 = iVar18;
    }
    if (local_598->borderCollapse == false) {
      drawFrameDecoration(this,painter,frame,fd,clip,&local_518);
    }
    QTextTable::format((QTextTable *)&row_start);
    iVar19 = QTextFormat::intProperty((QTextFormat *)&row_start,0x4104);
    iVar18 = local_570 - 1;
    if (iVar19 < (int)(local_570 - 1)) {
      iVar18 = iVar19;
    }
    QTextFormat::~QTextFormat((QTextFormat *)&row_start);
    iVar19 = (int)this_00;
    if (iVar33 < iVar26 >> 6) {
      do {
        iVar33 = iVar33 + 1;
        iVar3 = (local_598->super_QTextFrameData).effectiveTopMargin.val;
        iVar4 = (local_598->cellSpacing).val;
        iVar5 = (local_598->super_QTextFrameData).border.val;
        iVar6 = ((local_598->rowPositions).d.ptr)->val;
        if (0 < iVar18) {
          col = 0;
          do {
            if (0 < iVar16) {
              c = 0;
              do {
                _num_rows = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
                puStack_470 = &DAT_aaaaaaaaaaaaaaaa;
                QTextTable::cellAt((QTextTable *)&num_rows,iVar19,col);
                puVar30 = &DAT_006ac5b8;
                pPVar31 = (PaintContext *)&row_start;
                for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
                  *(undefined8 *)pPVar31 = *puVar30;
                  puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
                  pPVar31 = (PaintContext *)((long)pPVar31 + (ulong)bVar35 * -0x10 + 8);
                }
                row_start = context->cursorPosition;
                QPalette::QPalette(&QStack_4c0,&context->palette);
                qStack_4a8 = (context->clip).yp;
                local_4a0 = (context->clip).w;
                qStack_498 = (context->clip).h;
                local_4b0 = SUB84(clip->xp,0);
                uStack_4ac = (undefined4)((ulong)clip->xp >> 0x20);
                local_490.d = (context->selections).d.d;
                local_490.ptr = (context->selections).d.ptr;
                local_490.size = (context->selections).d.size;
                if (local_490.d != (Data *)0x0) {
                  LOCK();
                  ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + 1;
                  UNLOCK();
                }
                adjustContextSelectionsForCell
                          ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,col,c,
                           selectedTableCells);
                local_538 = 0xffffffff;
                uStack_534 = 0xffffffff;
                uStack_530 = 0xffffffff;
                uStack_52c = 0xffffffff;
                _col_start = (QTextFrame *)0xffffffffffffffff;
                dStack_540 = -NAN;
                QTextTableData::cellRect((QRectF *)&col_start,local_598,(QTextTableCell *)&num_rows)
                ;
                _col_start = (QTextFrame *)(local_4d8.xp + (double)_col_start);
                dStack_540 = (double)(int)((iVar33 * uVar20 + iVar3 + iVar4 + iVar5) - iVar6) *
                             0.015625 + dStack_540;
                cellRect.yp._0_4_ = SUB84(dStack_540,0);
                cellRect.xp = (qreal)_col_start;
                cellRect.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
                cellRect.w._0_4_ = local_538;
                cellRect.w._4_4_ = uStack_534;
                cellRect.h._0_4_ = uStack_530;
                cellRect.h._4_4_ = uStack_52c;
                bVar15 = cellClipTest(this_00,local_598,(PaintContext *)&row_start,
                                      (QTextTableCell *)&num_rows,cellRect);
                if (!bVar15) {
                  drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,this_00
                                ,local_598,col,c,&local_468,&local_4f8);
                }
                QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                          (&local_490);
                QPalette::~QPalette(&QStack_4c0);
                c = c + 1;
              } while (iVar16 != c);
            }
            col = col + 1;
          } while (col != iVar18);
        }
      } while (iVar33 != iVar26 >> 6);
    }
    uVar27 = 0;
    if ((0.0 < (context->clip).w) && (dVar9 = (context->clip).h, 0.0 < dVar9)) {
      pQVar8 = (local_598->rowPositions).d.ptr;
      uVar22 = (local_598->rowPositions).d.size;
      pQVar1 = pQVar8 + uVar22;
      dVar10 = (context->clip).yp;
      pQVar29 = pQVar8;
      if (0 < (long)uVar22) {
        uVar27 = uVar22;
        do {
          uVar32 = uVar27 >> 1;
          uVar27 = ~uVar32 + uVar27;
          pQVar14 = pQVar29 + uVar32 + 1;
          if ((int)((dVar10 - local_4d8.yp) * 64.0) <= pQVar29[uVar32].val) {
            uVar27 = uVar32;
            pQVar14 = pQVar29;
          }
          pQVar29 = pQVar14;
        } while (0 < (long)uVar27);
      }
      uVar27 = (ulong)((long)pQVar29 + (-4 - (long)pQVar8)) >> 2 & 0xffffffff;
      if (pQVar29 == pQVar8) {
        uVar27 = 0;
      }
      if (pQVar29 == pQVar1) {
        uVar27 = 0;
      }
      pQVar29 = pQVar8;
      if (0 < (long)uVar22) {
        do {
          uVar32 = uVar22 >> 1;
          uVar22 = ~uVar32 + uVar22;
          pQVar14 = pQVar29 + uVar32 + 1;
          if ((int)(((dVar9 + dVar10) - local_4d8.yp) * 64.0) < pQVar29[uVar32].val) {
            uVar22 = uVar32;
            pQVar14 = pQVar29;
          }
          pQVar29 = pQVar14;
        } while (0 < (long)uVar22);
      }
      if (pQVar29 != pQVar1) {
        local_570 = (uint)((ulong)((long)pQVar29 + (4 - (long)pQVar8)) >> 2);
      }
    }
    if (0 < iVar16) {
      iVar33 = 0;
      do {
        _row_start = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
        QStack_4c0.d._0_4_ = -0x55555556;
        QStack_4c0.d._4_4_ = -0x55555556;
        QTextTable::cellAt((QTextTable *)&row_start,iVar19,(int)uVar27);
        uVar20 = QTextTableCell::row((QTextTableCell *)&row_start);
        uVar22 = (ulong)uVar20;
        if ((int)uVar27 < (int)uVar20) {
          uVar22 = uVar27;
        }
        uVar27 = uVar22;
        iVar33 = iVar33 + 1;
      } while (iVar16 != iVar33);
    }
    if ((int)uVar27 < (int)local_570) {
      do {
        iVar33 = (int)uVar27;
        if (0 < iVar16) {
          iVar26 = 0;
          do {
            _num_rows = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_470 = &DAT_aaaaaaaaaaaaaaaa;
            QTextTable::cellAt((QTextTable *)&num_rows,iVar19,iVar33);
            puVar30 = &DAT_006ac5b8;
            pPVar31 = (PaintContext *)&row_start;
            for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
              *(undefined8 *)pPVar31 = *puVar30;
              puVar30 = puVar30 + (ulong)bVar35 * -2 + 1;
              pPVar31 = (PaintContext *)((long)pPVar31 + (ulong)bVar35 * -0x10 + 8);
            }
            row_start = context->cursorPosition;
            QPalette::QPalette(&QStack_4c0,&context->palette);
            qStack_4a8 = (context->clip).yp;
            local_4a0 = (context->clip).w;
            qStack_498 = (context->clip).h;
            local_4b0 = SUB84(clip->xp,0);
            uStack_4ac = (undefined4)((ulong)clip->xp >> 0x20);
            local_490.d = (context->selections).d.d;
            local_490.ptr = (context->selections).d.ptr;
            local_490.size = (context->selections).d.size;
            if (local_490.d != (Data *)0x0) {
              LOCK();
              ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_490.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            adjustContextSelectionsForCell
                      ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,iVar33,iVar26,
                       selectedTableCells);
            local_538 = 0xffffffff;
            uStack_534 = 0xffffffff;
            uStack_530 = 0xffffffff;
            uStack_52c = 0xffffffff;
            _col_start = (QTextFrame *)0xffffffffffffffff;
            dStack_540 = -NAN;
            QTextTableData::cellRect((QRectF *)&col_start,local_598,(QTextTableCell *)&num_rows);
            _col_start = (QTextFrame *)(local_4d8.xp + (double)_col_start);
            dStack_540 = local_4d8.yp + dStack_540;
            cellRect_00.yp._0_4_ = SUB84(dStack_540,0);
            cellRect_00.xp = (qreal)_col_start;
            cellRect_00.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
            cellRect_00.w._0_4_ = local_538;
            cellRect_00.w._4_4_ = uStack_534;
            cellRect_00.h._0_4_ = uStack_530;
            cellRect_00.h._4_4_ = uStack_52c;
            bVar15 = cellClipTest(this_00,local_598,(PaintContext *)&row_start,
                                  (QTextTableCell *)&num_rows,cellRect_00);
            if (!bVar15) {
              drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,this_00,
                            local_598,iVar33,iVar26,&local_468,&local_4f8);
            }
            QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                      (&local_490);
            QPalette::~QPalette(&QStack_4c0);
            iVar26 = iVar26 + 1;
          } while (iVar16 != iVar26);
        }
        uVar27 = (ulong)(iVar33 + 1U);
      } while (iVar33 + 1U != local_570);
    }
    if (selectedTableCells != local_440) {
      QtPrivate::sizedFree
                (selectedTableCells,CONCAT44(oldPen.d.d.ptr._4_4_,oldPen.d.d.ptr._0_4_) << 2);
    }
  }
  bVar15 = QTextBlock::isValid(&local_468);
  if (bVar15) {
    oldPen.d.d.ptr._0_4_ = 0xaaaaaaaa;
    oldPen.d.d.ptr._4_4_ = 0xaaaaaaaa;
    p = QPainter::pen(painter);
    QPen::QPen(&oldPen,p);
    pQVar25 = QPalette::brush(&context->palette,Current,Text);
    QPainter::setPen(painter,&((pQVar25->d)._M_t.
                               super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
    iVar16 = context->cursorPosition;
    iVar33 = QTextBlock::position(&local_468);
    this_01 = QTextBlock::layout(&local_468);
    QTextLayout::drawCursor(this_01,painter,&local_4f8,iVar16 - iVar33,this->cursorWidth);
    QPainter::setPen(painter,&oldPen);
    QPen::~QPen(&oldPen);
  }
LAB_004e3862:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrame(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           QTextFrame *frame) const
{
    QTextFrameData *fd = data(frame);
    // #######
    if (fd->layoutDirty)
        return;
    Q_ASSERT(!fd->sizeDirty);
    Q_ASSERT(!fd->layoutDirty);

    // floor the offset to avoid painting artefacts when drawing adjacent borders
    // we later also round table cell heights and widths
    const QPointF off = QPointF(QPointF(offset + fd->position.toPointF()).toPoint());

    if (context.clip.isValid()
        && (off.y() > context.clip.bottom() || off.y() + fd->size.height.toReal() < context.clip.top()
            || off.x() > context.clip.right() || off.x() + fd->size.width.toReal() < context.clip.left()))
        return;

     qCDebug(lcDraw) << "drawFrame" << frame->firstPosition() << "--" << frame->lastPosition() << "at" << offset;

    // if the cursor is /on/ a table border we may need to repaint it
    // afterwards, as we usually draw the decoration first
    QTextBlock cursorBlockNeedingRepaint;
    QPointF offsetOfRepaintedCursorBlock = off;

    QTextTable *table = qobject_cast<QTextTable *>(frame);
    const QRectF frameRect(off, fd->size.toSizeF());

    if (table) {
        const int rows = table->rows();
        const int columns = table->columns();
        QTextTableData *td = static_cast<QTextTableData *>(data(table));

        QVarLengthArray<int> selectedTableCells(context.selections.size() * 4);
        for (int i = 0; i < context.selections.size(); ++i) {
            const QAbstractTextDocumentLayout::Selection &s = context.selections.at(i);
            int row_start = -1, col_start = -1, num_rows = -1, num_cols = -1;

            if (s.cursor.currentTable() == table)
                s.cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

            selectedTableCells[i * 4] = row_start;
            selectedTableCells[i * 4 + 1] = col_start;
            selectedTableCells[i * 4 + 2] = num_rows;
            selectedTableCells[i * 4 + 3] = num_cols;
        }

        QFixed pageHeight = QFixed::fromReal(document->pageSize().height());
        if (pageHeight <= 0)
            pageHeight = QFIXED_MAX;

        QFixed absYPos = td->position.y;
        QTextFrame *parentFrame = table->parentFrame();
        while (parentFrame) {
            absYPos += data(parentFrame)->position.y;
            parentFrame = parentFrame->parentFrame();
        }
        const int tableStartPage = (absYPos / pageHeight).truncate();
        const int tableEndPage = ((absYPos + td->size.height) / pageHeight).truncate();

        // for borderCollapse draw frame decoration by drawing the outermost
        // cell edges with width = td->border
        if (!td->borderCollapse)
            drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        // draw the repeated table headers for table continuation after page breaks
        const int headerRowCount = qMin(table->format().headerRowCount(), rows - 1);
        int page = tableStartPage + 1;
        while (page <= tableEndPage) {
            const QFixed pageTop = page * pageHeight + td->effectiveTopMargin + td->cellSpacing + td->border;
            const qreal headerOffset = (pageTop - td->rowPositions.at(0)).toReal();
            for (int r = 0; r < headerRowCount; ++r) {
                for (int c = 0; c < columns; ++c) {
                    QTextTableCell cell = table->cellAt(r, c);
                    QAbstractTextDocumentLayout::PaintContext cell_context = context;
                    adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                    QRectF cellRect = td->cellRect(cell);

                    cellRect.translate(off.x(), headerOffset);
                    if (cellClipTest(table, td, cell_context, cell, cellRect))
                        continue;

                    drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                                  &offsetOfRepaintedCursorBlock);
                }
            }
            ++page;
        }

        int firstRow = 0;
        int lastRow = rows;

        if (context.clip.isValid()) {
            auto rowIt = std::lower_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.top() - off.y()));
            if (rowIt != td->rowPositions.constEnd() && rowIt != td->rowPositions.constBegin()) {
                --rowIt;
                firstRow = rowIt - td->rowPositions.constBegin();
            }

            rowIt = std::upper_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.bottom() - off.y()));
            if (rowIt != td->rowPositions.constEnd()) {
                ++rowIt;
                lastRow = rowIt - td->rowPositions.constBegin();
            }
        }

        for (int c = 0; c < columns; ++c) {
            QTextTableCell cell = table->cellAt(firstRow, c);
            firstRow = qMin(firstRow, cell.row());
        }

        for (int r = firstRow; r < lastRow; ++r) {
            for (int c = 0; c < columns; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                QAbstractTextDocumentLayout::PaintContext cell_context = context;
                adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                QRectF cellRect = td->cellRect(cell);

                cellRect.translate(off);
                if (cellClipTest(table, td, cell_context, cell, cellRect))
                    continue;

                drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                              &offsetOfRepaintedCursorBlock);
            }
        }

    } else {
        drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        QTextFrame::Iterator it = frame->begin();

        if (frame == docPrivate->rootFrame())
            it = frameIteratorForYPosition(QFixed::fromReal(context.clip.top()));

        QList<QTextFrame *> floats;
        const int numFloats = fd->floats.size();
        floats.reserve(numFloats);
        for (int i = 0; i < numFloats; ++i)
            floats.append(fd->floats.at(i));

        drawFlow(off, painter, context, it, floats, &cursorBlockNeedingRepaint);
    }

    if (cursorBlockNeedingRepaint.isValid()) {
        const QPen oldPen = painter->pen();
        painter->setPen(context.palette.color(QPalette::Text));
        const int cursorPos = context.cursorPosition - cursorBlockNeedingRepaint.position();
        cursorBlockNeedingRepaint.layout()->drawCursor(painter, offsetOfRepaintedCursorBlock,
                                                       cursorPos, cursorWidth);
        painter->setPen(oldPen);
    }

    return;
}